

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak_test.cc
# Opt level: O2

void KeccakFileTest(FileTest *t)

{
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *pcVar1;
  char *in_R9;
  size_t i;
  ulong uVar2;
  long lVar3;
  Bytes local_638;
  AssertionResult gtest_ar_4;
  Bytes local_618;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake256_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake128_expected;
  uint8_t sha3_512_digest [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_512_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_256_expected;
  BORINGSSL_keccak_st ctx;
  uint8_t shake128_output [512];
  uint8_t sha3_256_digest [32];
  uint8_t shake256_output [512];
  
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)shake128_output,"Input",(allocator<char> *)&ctx);
  shake256_output[0] = FileTest::GetBytes(t,&input,(string *)shake128_output);
  shake256_output[8] = '\0';
  shake256_output[9] = '\0';
  shake256_output[10] = '\0';
  shake256_output[0xb] = '\0';
  shake256_output[0xc] = '\0';
  shake256_output[0xd] = '\0';
  shake256_output[0xe] = '\0';
  shake256_output[0xf] = '\0';
  std::__cxx11::string::~string((string *)shake128_output);
  if (shake256_output[0] == '\0') {
    testing::Message::Message((Message *)&ctx);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)shake128_output,(internal *)shake256_output,
               (AssertionResult *)"t->GetBytes(&input, \"Input\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)sha3_512_digest,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
               ,0x1f,(char *)shake128_output._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)sha3_512_digest,(Message *)&ctx);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(shake256_output + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)shake128_output,"SHA3-256",(allocator<char> *)&ctx);
    shake256_output[0] = FileTest::GetBytes(t,&sha3_256_expected,(string *)shake128_output);
    shake256_output[8] = '\0';
    shake256_output[9] = '\0';
    shake256_output[10] = '\0';
    shake256_output[0xb] = '\0';
    shake256_output[0xc] = '\0';
    shake256_output[0xd] = '\0';
    shake256_output[0xe] = '\0';
    shake256_output[0xf] = '\0';
    std::__cxx11::string::~string((string *)shake128_output);
    if (shake256_output[0] == '\0') {
      testing::Message::Message((Message *)&ctx);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)shake128_output,(internal *)shake256_output,
                 (AssertionResult *)"t->GetBytes(&sha3_256_expected, \"SHA3-256\")","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)sha3_512_digest,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x20,(char *)shake128_output._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)sha3_512_digest,(Message *)&ctx);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(shake256_output + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)shake128_output,"SHA3-512",(allocator<char> *)&ctx);
      shake256_output[0] = FileTest::GetBytes(t,&sha3_512_expected,(string *)shake128_output);
      shake256_output[8] = '\0';
      shake256_output[9] = '\0';
      shake256_output[10] = '\0';
      shake256_output[0xb] = '\0';
      shake256_output[0xc] = '\0';
      shake256_output[0xd] = '\0';
      shake256_output[0xe] = '\0';
      shake256_output[0xf] = '\0';
      std::__cxx11::string::~string((string *)shake128_output);
      if (shake256_output[0] == '\0') {
        testing::Message::Message((Message *)&ctx);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)shake128_output,(internal *)shake256_output,
                   (AssertionResult *)"t->GetBytes(&sha3_512_expected, \"SHA3-512\")","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)sha3_512_digest,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                   ,0x21,(char *)shake128_output._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)sha3_512_digest,(Message *)&ctx);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(shake256_output + 8));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)shake128_output,"SHAKE-128",(allocator<char> *)&ctx);
        shake256_output[0] = FileTest::GetBytes(t,&shake128_expected,(string *)shake128_output);
        shake256_output[8] = '\0';
        shake256_output[9] = '\0';
        shake256_output[10] = '\0';
        shake256_output[0xb] = '\0';
        shake256_output[0xc] = '\0';
        shake256_output[0xd] = '\0';
        shake256_output[0xe] = '\0';
        shake256_output[0xf] = '\0';
        std::__cxx11::string::~string((string *)shake128_output);
        if (shake256_output[0] == '\0') {
          testing::Message::Message((Message *)&ctx);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)shake128_output,(internal *)shake256_output,
                     (AssertionResult *)"t->GetBytes(&shake128_expected, \"SHAKE-128\")","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)sha3_512_digest,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                     ,0x22,(char *)shake128_output._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)sha3_512_digest,(Message *)&ctx);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(shake256_output + 8));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)shake128_output,"SHAKE-256",(allocator<char> *)&ctx);
          shake256_output[0] = FileTest::GetBytes(t,&shake256_expected,(string *)shake128_output);
          shake256_output[8] = '\0';
          shake256_output[9] = '\0';
          shake256_output[10] = '\0';
          shake256_output[0xb] = '\0';
          shake256_output[0xc] = '\0';
          shake256_output[0xd] = '\0';
          shake256_output[0xe] = '\0';
          shake256_output[0xf] = '\0';
          std::__cxx11::string::~string((string *)shake128_output);
          if (shake256_output[0] != '\0') {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(shake256_output + 8));
            BORINGSSL_keccak(sha3_256_digest,0x20,
                             input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,boringssl_sha3_256);
            BORINGSSL_keccak(sha3_512_digest,0x40,
                             input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,boringssl_sha3_512);
            BORINGSSL_keccak(shake128_output,0x200,
                             input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,boringssl_shake128);
            BORINGSSL_keccak(shake256_output,0x200,
                             input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)input.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,boringssl_shake256);
            gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((long)sha3_256_expected.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)sha3_256_expected.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            gtest_ar_4._0_8_ =
                 sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_638.span_.size_ = 0x20;
            local_638.span_.data_ = sha3_256_digest;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&ctx,"Bytes(sha3_256_expected)","Bytes(sha3_256_digest)",
                       (Bytes *)&gtest_ar_4,&local_638);
            if ((undefined1)ctx.config == boringssl_sha3_256) {
              testing::Message::Message((Message *)&gtest_ar_4);
              if (ctx.state[0] == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)ctx.state[0];
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_638,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x32,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_638,(Message *)&gtest_ar_4);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
              if (gtest_ar_4._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ctx.state);
            gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((long)sha3_512_expected.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)sha3_512_expected.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            gtest_ar_4._0_8_ =
                 sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_638.span_.size_ = 0x40;
            local_638.span_.data_ = sha3_512_digest;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&ctx,"Bytes(sha3_512_expected)","Bytes(sha3_512_digest)",
                       (Bytes *)&gtest_ar_4,&local_638);
            if ((undefined1)ctx.config == boringssl_sha3_256) {
              testing::Message::Message((Message *)&gtest_ar_4);
              if (ctx.state[0] == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)ctx.state[0];
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_638,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x33,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_638,(Message *)&gtest_ar_4);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
              if (gtest_ar_4._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ctx.state);
            gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((long)shake128_expected.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)shake128_expected.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            gtest_ar_4._0_8_ =
                 shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_638.span_.size_ = 0x200;
            local_638.span_.data_ = shake128_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&ctx,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       (Bytes *)&gtest_ar_4,&local_638);
            if ((undefined1)ctx.config == boringssl_sha3_256) {
              testing::Message::Message((Message *)&gtest_ar_4);
              if (ctx.state[0] == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)ctx.state[0];
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_638,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x34,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_638,(Message *)&gtest_ar_4);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
              if (gtest_ar_4._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ctx.state);
            gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((long)shake256_expected.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)shake256_expected.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            gtest_ar_4._0_8_ =
                 shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_638.span_.size_ = 0x200;
            local_638.span_.data_ = shake256_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&ctx,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       (Bytes *)&gtest_ar_4,&local_638);
            if ((undefined1)ctx.config == boringssl_sha3_256) {
              testing::Message::Message((Message *)&gtest_ar_4);
              if (ctx.state[0] == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)ctx.state[0];
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_638,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x35,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_638,(Message *)&gtest_ar_4);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
              if (gtest_ar_4._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ctx.state);
            memset(shake128_output,0,0x200);
            BORINGSSL_keccak_init(&ctx,boringssl_shake128);
            BORINGSSL_keccak_absorb
                      (&ctx,input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            BORINGSSL_keccak_squeeze(&ctx,shake128_output,0x200);
            local_638.span_.size_ =
                 (long)shake128_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)shake128_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_638.span_.data_ =
                 shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_618.span_.size_ = 0x200;
            local_618.span_.data_ = shake128_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&gtest_ar_4,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       &local_638,&local_618);
            if (gtest_ar_4.success_ == false) {
              testing::Message::Message((Message *)&local_638);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar_4.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_618,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x3e,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_618,(Message *)&local_638);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
              if ((long *)local_638.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_638.span_.data_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_4.message_);
            memset(shake256_output,0,0x200);
            BORINGSSL_keccak_init(&ctx,boringssl_shake256);
            BORINGSSL_keccak_absorb
                      (&ctx,input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            BORINGSSL_keccak_squeeze(&ctx,shake256_output,0x200);
            local_638.span_.size_ =
                 (long)shake256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)shake256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_638.span_.data_ =
                 shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_618.span_.size_ = 0x200;
            local_618.span_.data_ = shake256_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&gtest_ar_4,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       &local_638,&local_618);
            if (gtest_ar_4.success_ == false) {
              testing::Message::Message((Message *)&local_638);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar_4.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_618,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x44,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_618,(Message *)&local_638);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
              if ((long *)local_638.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_638.span_.data_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_4.message_);
            memset(shake128_output,0,0x200);
            BORINGSSL_keccak_init(&ctx,boringssl_shake128);
            for (uVar2 = 0;
                uVar2 < (ulong)((long)input.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)input.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 1)
            {
              BORINGSSL_keccak_absorb
                        (&ctx,input.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar2,1);
            }
            for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
              BORINGSSL_keccak_squeeze(&ctx,shake128_output + lVar3,1);
            }
            local_638.span_.size_ =
                 (long)shake128_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)shake128_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_638.span_.data_ =
                 shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_618.span_.size_ = 0x200;
            local_618.span_.data_ = shake128_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&gtest_ar_4,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       &local_638,&local_618);
            if (gtest_ar_4.success_ == false) {
              testing::Message::Message((Message *)&local_638);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar_4.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_618,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x4f,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_618,(Message *)&local_638);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
              if ((long *)local_638.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_638.span_.data_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_4.message_);
            memset(shake256_output,0,0x200);
            BORINGSSL_keccak_init(&ctx,boringssl_shake256);
            for (uVar2 = 0;
                uVar2 < (ulong)((long)input.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)input.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 1)
            {
              BORINGSSL_keccak_absorb
                        (&ctx,input.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar2,1);
            }
            for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
              BORINGSSL_keccak_squeeze(&ctx,shake256_output + lVar3,1);
            }
            local_638.span_.size_ =
                 (long)shake256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)shake256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_638.span_.data_ =
                 shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_618.span_.size_ = 0x200;
            local_618.span_.data_ = shake256_output;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)&gtest_ar_4,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       &local_638,&local_618);
            if (gtest_ar_4.success_ == false) {
              testing::Message::Message((Message *)&local_638);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar_4.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_618,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x59,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_618,(Message *)&local_638);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
              if ((long *)local_638.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_638.span_.data_ + 8))();
              }
            }
            this = &gtest_ar_4.message_;
            goto LAB_002bc1f2;
          }
          testing::Message::Message((Message *)&ctx);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)shake128_output,(internal *)shake256_output,
                     (AssertionResult *)"t->GetBytes(&shake256_expected, \"SHAKE-256\")","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)sha3_512_digest,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                     ,0x23,(char *)shake128_output._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)sha3_512_digest,(Message *)&ctx);
        }
      }
    }
  }
  this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(shake256_output + 8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)sha3_512_digest);
  std::__cxx11::string::~string((string *)shake128_output);
  if ((long *)CONCAT71(ctx._1_7_,(undefined1)ctx.config) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(ctx._1_7_,(undefined1)ctx.config) + 8))();
  }
LAB_002bc1f2:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void KeccakFileTest(FileTest *t) {
  std::vector<uint8_t> input, sha3_256_expected, sha3_512_expected,
      shake128_expected, shake256_expected;
  ASSERT_TRUE(t->GetBytes(&input, "Input"));
  ASSERT_TRUE(t->GetBytes(&sha3_256_expected, "SHA3-256"));
  ASSERT_TRUE(t->GetBytes(&sha3_512_expected, "SHA3-512"));
  ASSERT_TRUE(t->GetBytes(&shake128_expected, "SHAKE-128"));
  ASSERT_TRUE(t->GetBytes(&shake256_expected, "SHAKE-256"));

  uint8_t sha3_256_digest[32];
  BORINGSSL_keccak(sha3_256_digest, sizeof(sha3_256_digest), input.data(),
                   input.size(), boringssl_sha3_256);
  uint8_t sha3_512_digest[64];
  BORINGSSL_keccak(sha3_512_digest, sizeof(sha3_512_digest), input.data(),
                   input.size(), boringssl_sha3_512);
  uint8_t shake128_output[512];
  BORINGSSL_keccak(shake128_output, sizeof(shake128_output), input.data(),
                   input.size(), boringssl_shake128);
  uint8_t shake256_output[512];
  BORINGSSL_keccak(shake256_output, sizeof(shake256_output), input.data(),
                   input.size(), boringssl_shake256);

  EXPECT_EQ(Bytes(sha3_256_expected), Bytes(sha3_256_digest));
  EXPECT_EQ(Bytes(sha3_512_expected), Bytes(sha3_512_digest));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  struct BORINGSSL_keccak_st ctx;

  // Single-pass absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake128_output, sizeof(shake128_output));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake256_output, sizeof(shake256_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  // Byte-by-byte absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake128_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake128_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake256_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake256_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));
}